

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess_test.cc
# Opt level: O0

void __thiscall SubprocessTestReadStdin::Run(SubprocessTestReadStdin *this)

{
  Test *pTVar1;
  bool bVar2;
  ExitStatus EVar3;
  Subprocess *pSVar4;
  size_type sVar5;
  allocator<char> local_39;
  string local_38;
  Subprocess *local_18;
  Subprocess *subproc;
  SubprocessTestReadStdin *this_local;
  
  subproc = (Subprocess *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"cat -",&local_39);
  pSVar4 = SubprocessSet::Add(&(this->super_SubprocessTest).subprocs_,&local_38,false);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  local_18 = pSVar4;
  while( true ) {
    bVar2 = Subprocess::Done(local_18);
    pTVar1 = g_current_test;
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    SubprocessSet::DoWork(&(this->super_SubprocessTest).subprocs_);
  }
  EVar3 = Subprocess::Finish(local_18);
  bVar2 = testing::Test::Check
                    (pTVar1,EVar3 == ExitSuccess,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/subprocess_test.cc"
                     ,0x104,"ExitSuccess == subproc->Finish()");
  pTVar1 = g_current_test;
  if (bVar2) {
    sVar5 = std::queue<Subprocess_*,_std::deque<Subprocess_*,_std::allocator<Subprocess_*>_>_>::size
                      (&(this->super_SubprocessTest).subprocs_.finished_);
    bVar2 = testing::Test::Check
                      (pTVar1,sVar5 == 1,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/subprocess_test.cc"
                       ,0x105,"1u == subprocs_.finished_.size()");
    if (!bVar2) {
      testing::Test::AddAssertionFailure(g_current_test);
    }
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  return;
}

Assistant:

TEST_F(SubprocessTest, ReadStdin) {
  Subprocess* subproc = subprocs_.Add("cat -");
  while (!subproc->Done()) {
    subprocs_.DoWork();
  }
  ASSERT_EQ(ExitSuccess, subproc->Finish());
  ASSERT_EQ(1u, subprocs_.finished_.size());
}